

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

QModelIndex * __thiscall
QColumnView::moveCursor
          (QModelIndex *__return_storage_ptr__,QColumnView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  char cVar1;
  LayoutDirection LVar2;
  CursorAction CVar3;
  QAbstractItemModel *pQVar4;
  long in_FS_OFFSET;
  QModelIndex local_90;
  undefined8 local_78;
  quintptr local_70;
  QAbstractItemModel *pQStack_68;
  long local_60 [3];
  undefined8 local_48;
  undefined1 *puStack_40;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
  if (pQVar4 == (QAbstractItemModel *)0x0) {
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      return __return_storage_ptr__;
    }
    goto LAB_0056ca03;
  }
  local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_48,(QAbstractItemView *)this);
  LVar2 = QWidget::layoutDirection((QWidget *)this);
  CVar3 = cursorAction;
  if (((LVar2 == RightToLeft) && (CVar3 = MoveRight, cursorAction != MoveLeft)) &&
     (CVar3 = MoveLeft, cursorAction != MoveRight)) {
    CVar3 = cursorAction;
  }
  if (CVar3 == MoveRight) {
    pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
    cVar1 = (**(code **)(*(long *)pQVar4 + 0x88))(pQVar4,&local_48);
    if (cVar1 == '\0') {
      if (local_38.ptr == (QAbstractItemModel *)0x0) goto LAB_0056c9c4;
      (**(code **)(*(long *)local_38.ptr + 0x70))
                (__return_storage_ptr__,local_38.ptr,(int)local_48 + 1,local_48._4_4_);
    }
    else {
      pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
      (**(code **)(*(long *)pQVar4 + 0x60))(__return_storage_ptr__,pQVar4,0,0,&local_48);
    }
  }
  else if (CVar3 == MoveLeft) {
    if (local_38.ptr == (QAbstractItemModel *)0x0) {
      local_60[0] = -1;
      local_60[1] = 0;
      local_60[2] = 0;
    }
    else {
      (**(code **)(*(long *)local_38.ptr + 0x68))(local_60,local_38.ptr,&local_48);
    }
    if (((-1 < (int)local_60[0]) && (-1 < local_60[0])) && (local_60[2] != 0)) {
      if (local_38.ptr == (QAbstractItemModel *)0x0) {
        local_78 = 0xffffffffffffffff;
        local_70 = 0;
        pQStack_68 = (QAbstractItemModel *)0x0;
      }
      else {
        (**(code **)(*(long *)local_38.ptr + 0x68))(&local_78,local_38.ptr,&local_48);
      }
      QAbstractItemView::rootIndex(&local_90,(QAbstractItemView *)this);
      if ((((int)local_78 != local_90.r) || (local_78._4_4_ != local_90.c)) ||
         ((local_70 != local_90.i || (pQStack_68 != local_90.m.ptr)))) {
        if (local_38.ptr != (QAbstractItemModel *)0x0) {
          (**(code **)(*(long *)local_38.ptr + 0x68))(__return_storage_ptr__,local_38.ptr,&local_48)
          ;
          goto LAB_0056c9e5;
        }
        goto LAB_0056c9c4;
      }
    }
    (__return_storage_ptr__->m).ptr = local_38.ptr;
    *(undefined1 **)__return_storage_ptr__ = local_48;
    __return_storage_ptr__->i = (quintptr)puStack_40;
  }
  else {
LAB_0056c9c4:
    __return_storage_ptr__->r = -1;
    __return_storage_ptr__->c = -1;
    __return_storage_ptr__->i = 0;
    (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
  }
LAB_0056c9e5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
LAB_0056ca03:
  __stack_chk_fail();
}

Assistant:

QModelIndex QColumnView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    // the child views which have focus get to deal with this first and if
    // they don't accept it then it comes up this view and we only grip left/right
    Q_UNUSED(modifiers);
    if (!model())
        return QModelIndex();

    QModelIndex current = currentIndex();
    if (isRightToLeft()) {
        if (cursorAction == MoveLeft)
            cursorAction = MoveRight;
        else if (cursorAction == MoveRight)
            cursorAction = MoveLeft;
    }
    switch (cursorAction) {
    case MoveLeft:
        if (current.parent().isValid() && current.parent() != rootIndex())
            return (current.parent());
        else
            return current;

    case MoveRight:
        if (model()->hasChildren(current))
            return model()->index(0, 0, current);
        else
            return current.sibling(current.row() + 1, current.column());

    default:
        break;
    }

    return QModelIndex();
}